

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll-multiple-handles.c
# Opt level: O3

int run_test_poll_multiple_handles(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  uv_loop_t *puVar3;
  int extraout_EDX;
  int64_t eval_b_1;
  int64_t eval_b_2;
  uv_poll_t second_poll_handle;
  uv_poll_t first_poll_handle;
  uv_poll_t local_108;
  uv_poll_t local_88;
  
  iVar1 = socket(2,1,0);
  local_88.data = (void *)(long)iVar1;
  local_108.data = (void *)0xffffffffffffffff;
  if (local_88.data == (void *)0xffffffffffffffff) {
    run_test_poll_multiple_handles_cold_13();
LAB_001b1332:
    run_test_poll_multiple_handles_cold_1();
LAB_001b133f:
    run_test_poll_multiple_handles_cold_2();
LAB_001b134c:
    run_test_poll_multiple_handles_cold_3();
LAB_001b1359:
    run_test_poll_multiple_handles_cold_4();
LAB_001b1366:
    run_test_poll_multiple_handles_cold_5();
LAB_001b1373:
    run_test_poll_multiple_handles_cold_6();
LAB_001b1380:
    run_test_poll_multiple_handles_cold_7();
LAB_001b138d:
    run_test_poll_multiple_handles_cold_8();
LAB_001b139a:
    run_test_poll_multiple_handles_cold_12();
LAB_001b139f:
    run_test_poll_multiple_handles_cold_9();
  }
  else {
    puVar3 = uv_default_loop();
    iVar2 = uv_poll_init(puVar3,&local_88,iVar1);
    local_108.data = (void *)(long)iVar2;
    if (local_108.data != (void *)0x0) goto LAB_001b1332;
    puVar3 = uv_default_loop();
    iVar1 = uv_poll_init(puVar3,&local_108,iVar1);
    if (iVar1 != 0) goto LAB_001b133f;
    iVar1 = uv_poll_start(&local_88,1,poll_cb);
    if (iVar1 != 0) goto LAB_001b134c;
    iVar1 = uv_poll_start(&local_108,1,poll_cb);
    if (iVar1 != -0x11) goto LAB_001b1359;
    iVar1 = uv_poll_stop(&local_88);
    if (iVar1 != 0) goto LAB_001b1366;
    iVar1 = uv_poll_start(&local_108,1,poll_cb);
    if (iVar1 != 0) goto LAB_001b1373;
    uv_close((uv_handle_t *)&local_88,close_cb);
    uv_unref((uv_handle_t *)&local_108);
    puVar3 = uv_default_loop();
    iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_001b1380;
    if (close_cb_called != 1) goto LAB_001b138d;
    uv_ref((uv_handle_t *)&local_108);
    iVar1 = uv_is_active((uv_handle_t *)&local_108);
    if (iVar1 == 0) goto LAB_001b139a;
    uv_close((uv_handle_t *)&local_108,close_cb);
    puVar3 = uv_default_loop();
    iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_001b139f;
    if (close_cb_called == 2) {
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      puVar3 = uv_default_loop();
      iVar1 = uv_loop_close(puVar3);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001b13b9;
    }
  }
  run_test_poll_multiple_handles_cold_10();
LAB_001b13b9:
  run_test_poll_multiple_handles_cold_11();
  if (extraout_EDX == 1) {
    return 1;
  }
  poll_cb_cold_1();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(poll_multiple_handles) {
  uv_os_sock_t sock;
  uv_poll_t first_poll_handle, second_poll_handle;

#ifdef _WIN32
  {
    struct WSAData wsa_data;
    int r = WSAStartup(MAKEWORD(2, 2), &wsa_data);
    ASSERT_OK(r);
  }
#endif

  sock = socket(AF_INET, SOCK_STREAM, 0);
#ifdef _WIN32
  ASSERT_NE(sock, INVALID_SOCKET);
#else
  ASSERT_NE(sock, -1);
#endif
  ASSERT_OK(uv_poll_init(uv_default_loop(), &first_poll_handle, sock));
  ASSERT_OK(uv_poll_init(uv_default_loop(), &second_poll_handle, sock));

  ASSERT_OK(uv_poll_start(&first_poll_handle, UV_READABLE, poll_cb));

  /* We may not start polling while another polling handle is active
   * on that fd.
   */
#ifndef _WIN32
  /* We do not track handles in an O(1) lookupable way on Windows,
   * so not checking that here.
   */
  ASSERT_EQ(uv_poll_start(&second_poll_handle, UV_READABLE, poll_cb),
            UV_EEXIST);
#endif

  /* After stopping the other polling handle, we now should be able to poll */
  ASSERT_OK(uv_poll_stop(&first_poll_handle));
  ASSERT_OK(uv_poll_start(&second_poll_handle, UV_READABLE, poll_cb));

  /* Closing an already stopped polling handle is safe in any case */
  uv_close((uv_handle_t*) &first_poll_handle, close_cb);

  uv_unref((uv_handle_t*) &second_poll_handle);
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT_EQ(1, close_cb_called);
  uv_ref((uv_handle_t*) &second_poll_handle);

  ASSERT(uv_is_active((uv_handle_t*) &second_poll_handle));
  uv_close((uv_handle_t*) &second_poll_handle, close_cb);

  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT_EQ(2, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}